

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::
WriteValue<duckdb::LogicalDependency,duckdb::LogicalDependencyHashFunction,duckdb::LogicalDependencyEquality>
          (Serializer *this,
          unordered_set<duckdb::LogicalDependency,_duckdb::LogicalDependencyHashFunction,_duckdb::LogicalDependencyEquality,_std::allocator<duckdb::LogicalDependency>_>
          *set)

{
  _Hash_node_base *p_Var1;
  
  (*this->_vptr_Serializer[8])(this,(set->_M_h)._M_element_count);
  for (p_Var1 = (set->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    WriteValue<duckdb::LogicalDependency>(this,(LogicalDependency *)(p_Var1 + 1));
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const duckdb::unordered_set<T, HASH, CMP> &set) {
		auto count = set.size();
		OnListBegin(count);
		for (auto &item : set) {
			WriteValue(item);
		}
		OnListEnd();
	}